

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::addMany(Roaring64Map *this,size_t n_args,uint64_t *vals)

{
  uint64_t in;
  uint32_t uVar1;
  uint32_t uVar2;
  long in_RDX;
  ulong in_RSI;
  BulkContext *in_RDI;
  uint32_t value_low;
  uint32_t value_high;
  uint64_t value;
  size_t lcv;
  BulkContext last_bulk_context;
  uint32_t last_value_high;
  Roaring *last_inner_bitmap;
  container_s *in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffac;
  ulong local_40;
  BulkContext local_38;
  uint32_t local_24;
  Roaring *local_20;
  long local_18;
  ulong local_10;
  
  local_20 = (Roaring *)0x0;
  local_24 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  BulkContext::BulkContext(&local_38);
  for (local_40 = 0; local_40 < local_10; local_40 = local_40 + 1) {
    in = *(uint64_t *)(local_18 + local_40 * 8);
    uVar1 = highBytes(in);
    uVar2 = lowBytes(in);
    if ((local_20 == (Roaring *)0x0) || (uVar1 != local_24)) {
      local_20 = lookupOrCreateInner((Roaring64Map *)CONCAT44(uVar1,uVar2),in_stack_ffffffffffffffac
                                    );
      local_24 = uVar1;
      BulkContext::BulkContext((BulkContext *)&stack0xffffffffffffffa0);
    }
    Roaring::addBulk((Roaring *)in_stack_ffffffffffffffa0,in_RDI,0);
  }
  return;
}

Assistant:

void addMany(size_t n_args, const uint64_t *vals) {
        // Potentially reduce outer map lookups by optimistically
        // assuming that adjacent values will belong to the same inner bitmap.
        Roaring *last_inner_bitmap = nullptr;
        uint32_t last_value_high = 0;
        BulkContext last_bulk_context;
        for (size_t lcv = 0; lcv < n_args; lcv++) {
            auto value = vals[lcv];
            auto value_high = highBytes(value);
            auto value_low = lowBytes(value);
            if (last_inner_bitmap == nullptr || value_high != last_value_high) {
                last_inner_bitmap = &lookupOrCreateInner(value_high);
                last_value_high = value_high;
                last_bulk_context = BulkContext{};
            }
            last_inner_bitmap->addBulk(last_bulk_context, value_low);
        }
    }